

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_mp3_open_memory_and_read_pcm_frames_s16
          (void *pData,size_t dataSize,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_dr_mp3 mp3;
  size_t in_stack_ffffffffffffc108;
  void *in_stack_ffffffffffffc110;
  ma_dr_mp3 *in_stack_ffffffffffffc118;
  ma_uint64 *in_stack_ffffffffffffe150;
  ma_dr_mp3_config *in_stack_ffffffffffffe158;
  ma_dr_mp3 *in_stack_ffffffffffffe160;
  undefined8 local_8;
  
  mVar1 = ma_dr_mp3_init_memory
                    (in_stack_ffffffffffffc118,in_stack_ffffffffffffc110,in_stack_ffffffffffffc108,
                     (ma_allocation_callbacks *)0x25a171);
  if (mVar1 == 0) {
    local_8 = (ma_int16 *)0x0;
  }
  else {
    local_8 = ma_dr_mp3__full_read_and_close_s16
                        (in_stack_ffffffffffffe160,in_stack_ffffffffffffe158,
                         in_stack_ffffffffffffe150);
  }
  return local_8;
}

Assistant:

MA_API ma_int16* ma_dr_mp3_open_memory_and_read_pcm_frames_s16(const void* pData, size_t dataSize, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_mp3 mp3;
    if (!ma_dr_mp3_init_memory(&mp3, pData, dataSize, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_mp3__full_read_and_close_s16(&mp3, pConfig, pTotalFrameCount);
}